

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O1

Var __thiscall
Js::DataView::GetValue<unsigned_int>(DataView *this,Var offset,char16 *funcName,BOOL isLittleEndian)

{
  uint uVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  uint64 uVar6;
  uint64 uVar7;
  undefined4 *puVar8;
  Var pvVar9;
  double value;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  uVar1 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  if (uVar1 < 4) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec1f,funcName);
  }
  uVar4 = ArrayBuffer::ToIndex(offset,-0x7ff5ec1f,scriptContext,uVar1 - 4,false);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true) {
    uVar1 = *(uint *)((this->buffer).ptr + uVar4);
    uVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (isLittleEndian != 0) {
      uVar5 = uVar1;
    }
    if ((int)uVar5 < 0) {
      value = (double)uVar5;
      uVar6 = NumberUtilities::ToSpecial(value);
      bVar3 = NumberUtilities::IsNan(value);
      if (bVar3) {
        uVar7 = NumberUtilities::ToSpecial(value);
        if (uVar7 != 0xfff8000000000000) {
          uVar7 = NumberUtilities::ToSpecial(value);
          if (uVar7 != 0x7ff8000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar8 = 0;
          }
        }
      }
      pvVar9 = (Var)(uVar6 ^ 0xfffc000000000000);
    }
    else {
      pvVar9 = (Var)((ulong)uVar5 | 0x1000000000000);
    }
    return pvVar9;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,funcName);
}

Assistant:

Var GetValue(Var offset, const char16* funcName, BOOL isLittleEndian = FALSE)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName item;
            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(typedBuffer, &item);
            }
            else
            {
                item = *typedBuffer;
            }
            return JavascriptNumber::ToVar(item, GetScriptContext());
        }